

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCDecoder.h
# Opt level: O3

void __thiscall
o3dgc::SC3DMCDecoder<unsigned_short>::SC3DMCDecoder(SC3DMCDecoder<unsigned_short> *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  memset(&this->m_params,0,0xc28);
  (this->m_params).m_encodeMode = O3DGC_SC3DMC_ENCODE_MODE_TFAN;
  (this->m_params).m_streamTypeMode = O3DGC_STREAM_TYPE_ASCII;
  (this->m_params).m_coordQuantBits = 0xe;
  (this->m_params).m_normalQuantBits = 8;
  (this->m_params).m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
  (this->m_params).m_normalPredMode = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
  lVar2 = 0x20e;
  do {
    puVar1 = (undefined8 *)((long)(this->m_params).m_floatAttributeQuantBits + lVar2 * 4 + -0x30);
    *puVar1 = 0x100000001;
    puVar1[1] = 0x100000001;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x30e);
  memset((this->m_params).m_intAttributePredMode,0,0x400);
  TriangleListDecoder<unsigned_short>::TriangleListDecoder(&this->m_triangleListDecoder);
  this->m_iterator = 0;
  this->m_streamSize = 0;
  memset(&this->m_quantFloatArray,0,0x2074);
  return;
}

Assistant:

SC3DMCDecoder(void)
                                    {
                                        m_iterator            = 0;
                                        m_streamSize          = 0;
                                        m_quantFloatArray     = 0;
                                        m_quantFloatArraySize = 0;
                                        m_normals             = 0;
                                        m_normalsSize         = 0;
                                        m_streamType          = O3DGC_STREAM_TYPE_UNKOWN;
                                    }